

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::SampleList::~SampleList(SampleList *this)

{
  ~SampleList(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

~SampleList		(void) {}